

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

void __thiscall leveldb::RecoveryTest::RecoveryTest(RecoveryTest *this)

{
  Env *pEVar1;
  Options local_b8;
  Status local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  RecoveryTest *local_10;
  RecoveryTest *this_local;
  
  local_10 = this;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__RecoveryTest_001eefa0;
  std::__cxx11::string::string((string *)&this->dbname_);
  pEVar1 = Env::Default();
  this->env_ = pEVar1;
  this->db_ = (DB *)0x0;
  testing::TempDir_abi_cxx11_();
  std::operator+(&local_30,&local_50,"/recovery_test");
  std::__cxx11::string::operator=((string *)&this->dbname_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  Options::Options(&local_b8);
  DestroyDB((leveldb *)&local_58,&this->dbname_,&local_b8);
  Status::~Status(&local_58);
  Open(this,(Options *)0x0);
  return;
}

Assistant:

RecoveryTest() : env_(Env::Default()), db_(nullptr) {
    dbname_ = testing::TempDir() + "/recovery_test";
    DestroyDB(dbname_, Options());
    Open();
  }